

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O3

void __thiscall deqp::egl::MakeCurrentPerfCase::~MakeCurrentPerfCase(MakeCurrentPerfCase *this)

{
  ~MakeCurrentPerfCase(this);
  operator_delete(this,0x128);
  return;
}

Assistant:

MakeCurrentPerfCase::~MakeCurrentPerfCase (void)
{
	deinit();
}